

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<Fad<long_double>_>::MultAdd
          (TPZMatrix<Fad<long_double>_> *this,TPZFMatrix<Fad<long_double>_> *x,
          TPZFMatrix<Fad<long_double>_> *y,TPZFMatrix<Fad<long_double>_> *z,Fad<long_double> *alpha,
          Fad<long_double> *beta,int opt)

{
  long lVar1;
  Fad<long_double> *pFVar2;
  long col;
  long lVar3;
  long lVar4;
  long lVar5;
  Fad<long_double> val;
  long local_158;
  FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> local_128;
  Fad<long_double> *local_118;
  Fad<long_double> *local_110;
  Fad<long_double> **local_108;
  Fad<long_double> *local_100;
  Fad<long_double> local_f8;
  undefined1 local_c8 [48];
  Fad<long_double> local_98;
  Fad<long_double> local_68;
  
  if (opt == 0) {
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 == (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_00d35b0f;
  }
  else {
    lVar1 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow;
LAB_00d35b0f:
    if ((this->super_TPZBaseMatrix).fRow == lVar1) goto LAB_00d35b23;
  }
  Error("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_00d35b23:
  local_158 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  if ((local_158 != (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol) ||
     ((x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow !=
      (y->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fRow)) {
    Error("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
    local_158 = (x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.fCol;
  }
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  lVar3 = (this->super_TPZBaseMatrix).fCol;
  Fad<long_double>::Fad(&local_68,beta);
  PrepareZ(this,y,z,&local_68,opt);
  Fad<long_double>::~Fad(&local_68);
  local_f8.val_ = (longdouble)0;
  local_f8.dx_.num_elts = 0;
  local_f8.defaultVal._8_2_ = 0;
  col = 0;
  if (lVar3 < 1) {
    lVar3 = col;
  }
  local_f8.dx_.ptr_to_data = (longdouble *)0x0;
  local_f8.defaultVal._0_8_ = 0;
  if (lVar1 < 1) {
    lVar1 = col;
  }
  if (local_158 < 1) {
    local_158 = col;
  }
  for (; col != local_158; col = col + 1) {
    lVar4 = 0;
    if (opt == 0) {
      for (; lVar4 != lVar3; lVar4 = lVar4 + 1) {
        for (lVar5 = 0; lVar1 != lVar5; lVar5 = lVar5 + 1) {
          pFVar2 = TPZFMatrix<Fad<long_double>_>::operator()(z,lVar5,col);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_98,this,lVar5,lVar4);
          local_118 = alpha;
          local_110 = &local_98;
          (*(x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])((Fad<long_double> *)local_c8,x,lVar4,col);
          local_108 = &local_118;
          local_128.fadexpr_.right_ = (Fad<long_double> *)&local_108;
          local_128.fadexpr_.left_ = pFVar2;
          local_100 = (Fad<long_double> *)local_c8;
          Fad<long_double>::operator=
                    (&local_f8,
                     (FadExpr<FadBinaryAdd<Fad<long_double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>_>_>_>
                      *)&local_128);
          Fad<long_double>::~Fad((Fad<long_double> *)local_c8);
          Fad<long_double>::~Fad(&local_98);
          (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(z,lVar5,col,&local_f8);
        }
      }
    }
    else {
      for (; lVar4 != lVar1; lVar4 = lVar4 + 1) {
        local_98.val_._0_8_ = 0;
        Fad<long_double>::operator=<double,_nullptr>(&local_f8,(double *)&local_98);
        for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_98,this,lVar5,lVar4);
          (*(x->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])((Fad<long_double> *)local_c8,x,lVar5,col);
          local_128.fadexpr_.left_ = &local_98;
          local_128.fadexpr_.right_ = (Fad<long_double> *)local_c8;
          Fad<long_double>::operator+=(&local_f8,&local_128);
          Fad<long_double>::~Fad((Fad<long_double> *)local_c8);
          Fad<long_double>::~Fad(&local_98);
        }
        local_c8._8_8_ = &local_f8;
        local_c8._0_8_ = alpha;
        Fad<long_double>::Fad<FadBinaryMul<Fad<long_double>,Fad<long_double>>>
                  (&local_98,(FadExpr<FadBinaryMul<Fad<long_double>,_Fad<long_double>_>_> *)local_c8
                  );
        (*(z->super_TPZMatrix<Fad<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(z,lVar4,col,&local_98);
        Fad<long_double>::~Fad(&local_98);
      }
    }
  }
  Fad<long_double>::~Fad(&local_f8);
  return;
}

Assistant:

void TPZMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
	if ((!opt && Cols() != x.Rows()) || Rows() != x.Rows())
		Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	int64_t rows = Rows();
	int64_t cols = Cols();
	int64_t xcols = x.Cols();
	int64_t ic, c, r;
	PrepareZ(y,z,beta,opt);
	TVar val = 0.;
	for (ic = 0; ic < xcols; ic++) {
		if(!opt) {
			for ( c = 0; c<cols; c++) {
				for ( r = 0; r < rows; r++ ) {
					val = z(r,ic) + alpha * GetVal(r,c) * x.GetVal(c,ic);
					z.PutVal(r,ic,val);
				}
			}
		} else {
			for (r = 0; r<rows; r++) {
            	val = 0.;
				for(c = 0; c<cols; c++) {
					val += GetVal(c,r)* x.GetVal(c,ic);
				}
				z.PutVal(r,ic,alpha*val);
			}
		}
	}
}